

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterBeam.h
# Opt level: O0

UnderwaterAcousticEmitterBeam * __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam::operator=
          (UnderwaterAcousticEmitterBeam *this,UnderwaterAcousticEmitterBeam *param_1)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  UnderwaterAcousticEmitterBeam *param_1_local;
  UnderwaterAcousticEmitterBeam *this_local;
  
  DataTypeBase::operator=(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  KVar1 = param_1->m_ui8BeamIDNumber;
  KVar2 = param_1->m_ui16Padding1;
  this->m_ui8BeamDataLength = param_1->m_ui8BeamDataLength;
  this->m_ui8BeamIDNumber = KVar1;
  this->m_ui16Padding1 = KVar2;
  UnderwaterAcousticFundamentalParameterData::operator=(&this->m_UAFPD,&param_1->m_UAFPD);
  return this;
}

Assistant:

class KDIS_EXPORT UnderwaterAcousticEmitterBeam : public DataTypeBase
{
protected:

    KUINT8 m_ui8BeamDataLength;

    KUINT8 m_ui8BeamIDNumber;

    KUINT16 m_ui16Padding1;

    UnderwaterAcousticFundamentalParameterData m_UAFPD;

public:

    static const KUINT16 UNDERWATER_ACOUSTIC_EMITTER_BEAM_SIZE = 24;

    UnderwaterAcousticEmitterBeam();

    UnderwaterAcousticEmitterBeam(KDataStream &stream) noexcept(false);

    UnderwaterAcousticEmitterBeam( KUINT8 ID, const UnderwaterAcousticFundamentalParameterData & UAFPD );

    virtual ~UnderwaterAcousticEmitterBeam();

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam::GetSystemDataLength
    // Description: Length of the emission system in 32 bit words.
    //              E.G 1 = 32 bits 4 octets. Calculated automatically.
    //************************************
    KUINT8 GetBeamDataLength() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam::SetUnderwaterAcousticEmitterBeamIDNumber
    //              KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam::GetUnderwaterAcousticEmitterBeamIDNumber
    // Description: Unique ID for emitter beam, Once established for an exercise
    //              no other beam may use this ID.
    // Parameter:   KUINT8 ID, void
    //************************************
    void SetUnderwaterAcousticEmitterBeamIDNumber( KUINT8 ID );
    KUINT8 GetUnderwaterAcousticEmitterBeamIDNumber() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam::SetSSetUnderwaterAcousticFundamentalParameterDataystemType
    //              KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam::GetUnderwaterAcousticFundamentalParameterData
    // Description: System Type
    // Parameter:   UnderwaterAcousticFundamentalParameterData AEFPD, void
    //************************************
    void SetUnderwaterAcousticFundamentalParameterData( const UnderwaterAcousticFundamentalParameterData & UAFPD );
    const UnderwaterAcousticFundamentalParameterData & GetUnderwaterAcousticFundamentalParameterData() const;
    UnderwaterAcousticFundamentalParameterData & GetUnderwaterAcousticFundamentalParameterData();

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const UnderwaterAcousticEmitterBeam & Value ) const;
    KBOOL operator != ( const UnderwaterAcousticEmitterBeam & Value ) const;
}